

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O2

void __thiscall kj::std::anon_unknown_0::TestCase30::run(TestCase30 *this)

{
  int iVar1;
  char *__nbytes;
  StdInputStream in;
  char buf [7];
  StdOutputStream out;
  size_t local_1e8;
  byte *pbStack_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  stringstream ss;
  ostream local_180 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_001c80e0;
  out.stream_ = local_180;
  out.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__ArrayOutputStream_001c8128;
  local_1e8 = 0;
  pbStack_1e0 = (byte *)0x0;
  local_1d8 = "foo";
  local_1d0 = 3;
  local_1c8 = 0;
  uStack_1c0 = 0;
  __nbytes = "bar";
  local_1b8 = "bar";
  local_1b0 = 3;
  local_1a8 = 0;
  uStack_1a0 = 0;
  in.stream_ = (istream *)&ss;
  StdOutputStream::write(&out,(int)&local_1e8,(void *)0x5,0x18dc81);
  InputStream::read(&in.super_InputStream,(int)buf,(void *)0x6,(size_t)__nbytes);
  buf[6] = '\0';
  iVar1 = bcmp("foobar",&buf,7);
  if ((iVar1 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
               ,0x35,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
               (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
               (char (*) [7])"foobar",&buf);
  }
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&out);
  BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&in);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

TEST(StdIoStream, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays
  // are empty.  (This used to not work in some cases.)

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}